

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O1

void __thiscall QPrintPreviewDialogPrivate::updateNavActions(QPrintPreviewDialogPrivate *this)

{
  QLineEdit *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QPrintPreviewWidget::currentPage((QPrintPreviewWidget *)this->preview);
  QPrintPreviewWidget::pageCount((QPrintPreviewWidget *)this->preview);
  QAction::setEnabled(SUB81(this->nextPageAction,0));
  QAction::setEnabled(SUB81(this->prevPageAction,0));
  QAction::setEnabled(SUB81(this->firstPageAction,0));
  QAction::setEnabled(SUB81(this->lastPageAction,0));
  pQVar1 = this->pageNumEdit;
  QString::number((int)local_40,iVar2);
  QLineEdit::setText((QString *)pQVar1);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::updateNavActions()
{
    int curPage = preview->currentPage();
    int numPages = preview->pageCount();
    nextPageAction->setEnabled(curPage < numPages);
    prevPageAction->setEnabled(curPage > 1);
    firstPageAction->setEnabled(curPage > 1);
    lastPageAction->setEnabled(curPage < numPages);
    pageNumEdit->setText(QString::number(curPage));
}